

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

void miniscript::internal::BuildBack<XOnlyPubKey>
               (MiniscriptContext script_ctx,Fragment nt,
               vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
               *constructed,bool reverse)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Node<XOnlyPubKey> *pNVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  local_78;
  NoDupCheck local_59;
  Node<XOnlyPubKey> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> local_48;
  Fragment local_2c;
  MiniscriptContext local_28;
  undefined1 local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (constructed->
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = psVar1[-1].
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       psVar1[-1].
       super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (constructed->
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
  local_2c = nt;
  local_28 = script_ctx;
  if ((int)CONCAT71(in_register_00000009,reverse) == 0) {
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::reserve(&local_78,2);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,psVar1 + -2);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,&local_48);
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<miniscript::Node<XOnlyPubKey>const,std::allocator<miniscript::Node<XOnlyPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>>
              (&_Stack_50,&local_58,(allocator<miniscript::Node<XOnlyPubKey>_> *)&local_21,&local_59
               ,&local_28,&local_2c,&local_78);
  }
  else {
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::reserve(&local_78,2);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,&local_48);
    std::
    vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
    ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
              ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                *)&local_78,psVar1 + -2);
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<miniscript::Node<XOnlyPubKey>const,std::allocator<miniscript::Node<XOnlyPubKey>>,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext_const&,miniscript::Fragment&,std::vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>>
              (&_Stack_50,&local_58,(allocator<miniscript::Node<XOnlyPubKey>_> *)&local_21,&local_59
               ,&local_28,&local_2c,&local_78);
  }
  _Var3._M_pi = _Stack_50._M_pi;
  pNVar2 = local_58;
  psVar1 = (constructed->
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (Node<XOnlyPubKey> *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = psVar1[-1].
         super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pNVar2;
  psVar1[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::~vector(&local_78);
  if (local_48.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BuildBack(const MiniscriptContext script_ctx, Fragment nt, std::vector<NodeRef<Key>>& constructed, const bool reverse = false)
{
    NodeRef<Key> child = std::move(constructed.back());
    constructed.pop_back();
    if (reverse) {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(child), std::move(constructed.back())));
    } else {
        constructed.back() = MakeNodeRef<Key>(internal::NoDupCheck{}, script_ctx, nt, Vector(std::move(constructed.back()), std::move(child)));
    }
}